

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O1

void __thiscall absl::Cord::RemoveSuffix(Cord *this,size_t n)

{
  RefcountAndFlags *pRVar1;
  uint uVar2;
  byte bVar3;
  uint8_t uVar4;
  CordRep *pCVar5;
  CordRepBtree *pCVar6;
  size_t x;
  ulong uVar7;
  CordRepBtree *pCVar8;
  AlphaNum *in_R9;
  CordzInfo *this_00;
  CordRepBtree *tree;
  string death_message;
  CordRep *local_138;
  CordRepBtree *local_130;
  char *local_128;
  string local_100;
  string local_e0 [32];
  AlphaNum local_c0;
  AlphaNum local_90;
  AlphaNum local_60;
  
  bVar3 = (this->contents_).data_.rep_.field_0.data[0];
  if (((long)(char)bVar3 & 1U) == 0) {
    uVar7 = (ulong)(long)(char)bVar3 >> 1;
  }
  else {
    uVar7 = ((this->contents_).data_.rep_.field_0.as_tree.rep)->length;
  }
  if (uVar7 < n) {
    std::__cxx11::string::string<std::allocator<char>>
              (local_e0,"Check n <= size() failed: ",(allocator<char> *)&local_130);
    local_130 = (CordRepBtree *)0x16;
    local_128 = "Requested suffix size ";
    AlphaNum::AlphaNum(&local_60,n);
    local_90.piece_._M_len = 0x15;
    local_90.piece_._M_str = " exceeds Cord\'s size ";
    x = size(this);
    AlphaNum::AlphaNum(&local_c0,x);
    StrCat_abi_cxx11_(&local_100,(absl *)&local_130,&local_60,&local_90,&local_c0,in_R9);
    std::__cxx11::string::operator+=(local_e0,(string *)&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    (*(code *)raw_log_internal::internal_log_function_abi_cxx11_)
              (3,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O1/_deps/absl-src/absl/strings/cord.cc"
               ,0x2c5,local_e0);
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O1/_deps/absl-src/absl/strings/cord.cc"
                  ,0x2c5,"void absl::Cord::RemoveSuffix(size_t)");
  }
  pCVar5 = (this->contents_).data_.rep_.field_0.as_tree.rep;
  if ((pCVar5 != (CordRep *)0x0 && (bVar3 & 1) != 0) && (pCVar5->length == 0)) {
    RemoveSuffix();
  }
  bVar3 = (this->contents_).data_.rep_.field_0.data[0];
  this_00 = (CordzInfo *)(long)(char)bVar3;
  tree = (CordRepBtree *)(this->contents_).data_.rep_.field_0.as_tree.rep;
  if (tree == (CordRepBtree *)0x0 || ((ulong)this_00 & 1) == 0) {
    if ((bVar3 & 1) != 0) {
      RemoveSuffix();
LAB_00131d1a:
      cord_internal::CordzInfo::Lock(this_00,kRemoveSuffix);
      goto LAB_00131ab0;
    }
    if (0x1f < bVar3) {
      __assert_fail("tag <= kMaxInline",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O1/_deps/absl-src/absl/strings/cord.cc"
                    ,0xb9,"void absl::Cord::InlineRep::reduce_size(size_t)");
    }
    uVar7 = (ulong)this_00 >> 1;
    this_00 = (CordzInfo *)(uVar7 - n);
    if (uVar7 < n) {
      __assert_fail("tag >= n",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O1/_deps/absl-src/absl/strings/cord.cc"
                    ,0xba,"void absl::Cord::InlineRep::reduce_size(size_t)");
    }
    memset((void *)((long)this + (long)this_00 + 1),0,n);
    if (this_00 < (CordzInfo *)0x10) {
      (this->contents_).data_.rep_.field_0.data[0] = (char)this_00 * '\x02';
      return;
    }
    RemoveSuffix();
LAB_00131d7a:
    cord_internal::CordRep::Destroy(&tree->super_CordRep);
  }
  else {
    this_00 = cord_internal::InlineData::cordz_info((InlineData *)this);
    if (this_00 != (CordzInfo *)0x0) goto LAB_00131d1a;
LAB_00131ab0:
    if ((tree->super_CordRep).tag == '\x02') {
      RemoveSuffix();
      tree = local_130;
    }
    if (n < (tree->super_CordRep).length) {
      uVar4 = (tree->super_CordRep).tag;
      pCVar6 = tree;
      if (uVar4 != '\x05') {
        if (uVar4 == '\x03') {
          pCVar6 = (CordRepBtree *)cord_internal::CordRepBtree::RemoveSuffix(tree,n);
          goto LAB_00131bf2;
        }
        if ((tree->super_CordRep).refcount.count_.super___atomic_base<int>._M_i == 2) {
          bVar3 = (tree->super_CordRep).tag;
          if (bVar3 != 1 && bVar3 < 6) {
            __assert_fail("tree->IsFlat() || tree->IsSubstring()",
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O1/_deps/absl-src/absl/strings/cord.cc"
                          ,0x2d4,"void absl::Cord::RemoveSuffix(size_t)");
          }
          (tree->super_CordRep).length = (tree->super_CordRep).length - n;
          goto LAB_00131bf2;
        }
      }
      uVar7 = (tree->super_CordRep).length;
      if (uVar7 - n == 0) {
        __assert_fail("n != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                      ,0x1a3,
                      "static CordRep *absl::cord_internal::CordRepSubstring::Substring(CordRep *, size_t, size_t)"
                     );
      }
      if (uVar7 == 0) {
        __assert_fail("pos < rep->length",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                      ,0x1a4,
                      "static CordRep *absl::cord_internal::CordRepSubstring::Substring(CordRep *, size_t, size_t)"
                     );
      }
      if (uVar7 < n) {
        __assert_fail("n <= rep->length - pos",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                      ,0x1a5,
                      "static CordRep *absl::cord_internal::CordRepSubstring::Substring(CordRep *, size_t, size_t)"
                     );
      }
      if (n == 0) {
        LOCK();
        pRVar1 = &(tree->super_CordRep).refcount;
        (pRVar1->count_).super___atomic_base<int>._M_i =
             (pRVar1->count_).super___atomic_base<int>._M_i + 2;
        UNLOCK();
      }
      else {
        if ((tree->super_CordRep).tag == '\x01') {
          local_138 = tree->edges_[0];
          pCVar8 = (CordRepBtree *)tree->edges_[1];
        }
        else {
          local_138 = (CordRep *)0x0;
          pCVar8 = tree;
        }
        pCVar6 = (CordRepBtree *)operator_new(0x20);
        (pCVar6->super_CordRep).length = 0;
        (pCVar6->super_CordRep).refcount = (atomic<int>)0x0;
        (pCVar6->super_CordRep).tag = '\0';
        (pCVar6->super_CordRep).storage[0] = '\0';
        (pCVar6->super_CordRep).storage[1] = '\0';
        (pCVar6->super_CordRep).storage[2] = '\0';
        pCVar6->edges_[0] = (CordRep *)0x0;
        pCVar6->edges_[1] = (CordRep *)0x0;
        (pCVar6->super_CordRep).refcount.count_.super___atomic_base<int>._M_i = 2;
        (pCVar6->super_CordRep).length = uVar7 - n;
        (pCVar6->super_CordRep).tag = '\x01';
        pCVar6->edges_[0] = local_138;
        if (pCVar8 == (CordRepBtree *)0x0) {
          __assert_fail("rep != nullptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                        ,0x371,"static CordRep *absl::cord_internal::CordRep::Ref(CordRep *)");
        }
        LOCK();
        pRVar1 = &(pCVar8->super_CordRep).refcount;
        (pRVar1->count_).super___atomic_base<int>._M_i =
             (pRVar1->count_).super___atomic_base<int>._M_i + 2;
        UNLOCK();
        pCVar6->edges_[1] = &pCVar8->super_CordRep;
      }
      LOCK();
      pRVar1 = &(tree->super_CordRep).refcount;
      uVar2 = (pRVar1->count_).super___atomic_base<int>._M_i;
      (pRVar1->count_).super___atomic_base<int>._M_i =
           (pRVar1->count_).super___atomic_base<int>._M_i + -2;
      UNLOCK();
      if ((uVar2 & 1) == 0 && (int)uVar2 < 1) {
LAB_00131df1:
        __assert_fail("refcount > 0 || refcount & kImmortalFlag",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                      ,0xaa,
                      "bool absl::cord_internal::RefcountAndFlags::DecrementExpectHighRefcount()");
      }
      if (uVar2 == 2) {
        cord_internal::CordRep::Destroy(&tree->super_CordRep);
      }
      goto LAB_00131bf2;
    }
    LOCK();
    pRVar1 = &(tree->super_CordRep).refcount;
    uVar2 = (pRVar1->count_).super___atomic_base<int>._M_i;
    (pRVar1->count_).super___atomic_base<int>._M_i =
         (pRVar1->count_).super___atomic_base<int>._M_i + -2;
    UNLOCK();
    if ((uVar2 & 1) == 0 && (int)uVar2 < 1) goto LAB_00131df1;
    if (uVar2 == 2) goto LAB_00131d7a;
  }
  pCVar6 = (CordRepBtree *)0x0;
LAB_00131bf2:
  if (((this->contents_).data_.rep_.field_0.data[0] & 1U) == 0) {
    __assert_fail("data_.is_tree()",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O1/_deps/absl-src/absl/strings/cord.h"
                  ,0x4e7,
                  "void absl::Cord::InlineRep::SetTreeOrEmpty(absl::Nullable<CordRep *>, const CordzUpdateScope &)"
                 );
  }
  if (pCVar6 == (CordRepBtree *)0x0) {
    (this->contents_).data_.rep_.field_0.as_tree.cordz_info = 0;
    (this->contents_).data_.rep_.field_0.as_tree.rep = (CordRep *)0x0;
  }
  else {
    (this->contents_).data_.rep_.field_0.as_tree.rep = &pCVar6->super_CordRep;
  }
  if (this_00 == (CordzInfo *)0x0) {
    return;
  }
  Mutex::AssertHeld(&this_00->mutex_);
  this_00->rep_ = &pCVar6->super_CordRep;
  cord_internal::CordzInfo::Unlock(this_00);
  return;
}

Assistant:

void Cord::RemoveSuffix(size_t n) {
  ABSL_INTERNAL_CHECK(n <= size(),
                      absl::StrCat("Requested suffix size ", n,
                                   " exceeds Cord's size ", size()));
  contents_.MaybeRemoveEmptyCrcNode();
  CordRep* tree = contents_.tree();
  if (tree == nullptr) {
    contents_.reduce_size(n);
  } else {
    auto constexpr method = CordzUpdateTracker::kRemoveSuffix;
    CordzUpdateScope scope(contents_.cordz_info(), method);
    tree = cord_internal::RemoveCrcNode(tree);
    if (n >= tree->length) {
      CordRep::Unref(tree);
      tree = nullptr;
    } else if (tree->IsBtree()) {
      tree = CordRepBtree::RemoveSuffix(tree->btree(), n);
    } else if (!tree->IsExternal() && tree->refcount.IsOne()) {
      assert(tree->IsFlat() || tree->IsSubstring());
      tree->length -= n;
    } else {
      CordRep* rep = CordRepSubstring::Substring(tree, 0, tree->length - n);
      CordRep::Unref(tree);
      tree = rep;
    }
    contents_.SetTreeOrEmpty(tree, scope);
  }
}